

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall
helics::FederateState::FederateState(FederateState *this,string *fedName,CoreFederateInfo *fedInfo)

{
  _Rb_tree_header *p_Var1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  TimeCoordinator *this_00;
  vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  *__range1;
  pair<int,_TimeRepresentation<count_time<9,_long>_>_> *prop;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  std::__cxx11::string::string
            ((string *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fedName);
  this_00 = (TimeCoordinator *)operator_new(0x268);
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:112:35)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:112:35)>
             ::_M_manager;
  local_70._M_unused._M_object = this;
  TimeCoordinator::TimeCoordinator
            (this_00,(function<void_(const_helics::ActionMessage_&)> *)&local_70);
  (this->timeCoord)._M_t.
  super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>._M_t
  .super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>.
  super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl = this_00;
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_70);
  this->local_id = -2000000000;
  this->global_id = (GlobalFederateId)0x8831d580;
  this->state = CREATED;
  this->only_transmit_on_change = false;
  this->realtime = false;
  this->observer = false;
  this->reentrant = false;
  this->mSourceOnly = false;
  this->mCallbackBased = false;
  this->strict_input_type_checking = false;
  this->ignore_unit_mismatch = false;
  this->mSlowResponding = false;
  this->mAllowRemoteControl = true;
  InterfaceInfo::InterfaceInfo(&this->interfaceInformation);
  std::make_unique<helics::LogManager>();
  this->maxLogLevel = -4;
  (this->init_transmitted)._M_base._M_i = false;
  this->mParent = (CommonCore *)0x0;
  this->indexGroup = 0;
  this->wait_for_current_time = false;
  this->ignore_time_mismatch_warnings = false;
  this->mProfilerActive = false;
  this->mLocalProfileCapture = false;
  this->errorCode = 0;
  (this->errorString)._M_dataplus._M_p = (pointer)&(this->errorString).field_2;
  (this->errorString)._M_string_length = 0;
  (this->errorString).field_2._M_local_buf[0] = '\0';
  (this->start_clock_time).__d.__r = 0;
  (this->rt_lag).internalTimeCode = 0;
  (this->rt_lead).internalTimeCode = 0;
  (this->grantTimeOutPeriod).internalTimeCode = 0;
  this->realTimeTimerIndex = -1;
  this->grantTimeoutTimeIndex = -1;
  (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->initRequested = (__atomic_base<bool>)0x0;
  this->requestingMode = (__atomic_base<bool>)0x0;
  this->initIterating = (__atomic_base<bool>)0x0;
  this->iterating = false;
  this->timeGranted_mode = false;
  this->terminate_on_error = false;
  this->lastIterationRequest = NO_ITERATIONS;
  this->timeMethod = DISTRIBUTED;
  this->mGrantCount = 0;
  gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  BlockingQueue(&this->queue);
  gmlc::containers::
  BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
  ::BlockingQueue(&this->commandQueue);
  (this->interfaceFlags).super___atomic_base<unsigned_short>._M_i = 0;
  (this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->delayQueues)._M_t._M_impl.super__Rb_tree_header;
  (this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->delayQueues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->events).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->events).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->events).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eventMessages).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eventMessages).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eventMessages).
  super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->delayedFederates).
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->delayedFederates).
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->delayedFederates).
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->time_granted).internalTimeCode = -0x7fffffffffffffff;
  (this->allowed_send_time).internalTimeCode = -0x7fffffffffffffff;
  (this->minimumReceiveTime).internalTimeCode = -0x7fffffffffffffff;
  (this->processing).super___atomic_flag_base._M_i = false;
  (this->queryCallbacks).
  super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->queryCallbacks).
  super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->queryCallbacks).
  super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fedCallbacks).super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->fedCallbacks).super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->queueProcessing)._M_base._M_i = false;
  ppVar2 = (fedInfo->timeProps).
           super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (fedInfo->timeProps).
                super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
    setProperty(this,ppVar5->first,(Time)(ppVar5->second).internalTimeCode);
  }
  ppVar3 = (fedInfo->intProps).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ppVar6 = (fedInfo->intProps).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3; ppVar6 = ppVar6 + 1) {
    setProperty(this,ppVar6->first,ppVar6->second);
  }
  ppVar4 = (fedInfo->flagProps).
           super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ppVar7 = (fedInfo->flagProps).
                super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
                _M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar4; ppVar7 = ppVar7 + 1) {
    setOptionFlag(this,ppVar7->first,ppVar7->second);
  }
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:125:9)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:125:9)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  std::function<void_(helics::ActionMessage_&&)>::operator=
            ((function<void_(helics::ActionMessage_&&)> *)
             &((this->mLogManager)._M_t.
               super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
               .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->mTransmit,
             (function<void_(helics::ActionMessage_&&)> *)&local_50);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_50);
  this->maxLogLevel =
       (((this->mLogManager)._M_t.
         super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>._M_t.
         super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>.
         super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->maxLogLevel).
       super___atomic_base<int>._M_i;
  return;
}

Assistant:

FederateState::FederateState(const std::string& fedName, const CoreFederateInfo& fedInfo):
    name(fedName),
    timeCoord(new TimeCoordinator([this](const ActionMessage& msg) { routeMessage(msg); })),
    global_id{GlobalFederateId()}, mLogManager(std::make_unique<LogManager>())
{
    for (const auto& prop : fedInfo.timeProps) {
        setProperty(prop.first, prop.second);
    }
    for (const auto& prop : fedInfo.intProps) {
        setProperty(prop.first, prop.second);
    }
    for (const auto& prop : fedInfo.flagProps) {
        setOptionFlag(prop.first, prop.second);
    }
    mLogManager->setTransmitCallback(
        [this](ActionMessage&& message) { mParent->addActionMessage(std::move(message)); });
    maxLogLevel = mLogManager->getMaxLevel();
}